

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetItemDefaultFocus(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiContext *g;
  
  pIVar7 = GImGui;
  if ((((GImGui->CurrentWindow->Appearing == true) &&
       (pIVar6 = GImGui->NavWindow, pIVar6 == GImGui->CurrentWindow->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (pIVar6->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar7->NavInitResultId = (pIVar6->DC).LastItemId;
    fVar1 = (pIVar6->Pos).x;
    fVar2 = (pIVar6->Pos).y;
    fVar3 = (pIVar6->DC).LastItemRect.Min.y;
    fVar4 = (pIVar6->DC).LastItemRect.Max.x;
    fVar5 = (pIVar6->DC).LastItemRect.Max.y;
    (pIVar7->NavInitResultRectRel).Min.x = (pIVar6->DC).LastItemRect.Min.x - fVar1;
    (pIVar7->NavInitResultRectRel).Min.y = fVar3 - fVar2;
    (pIVar7->NavInitResultRectRel).Max.x = fVar4 - fVar1;
    (pIVar7->NavInitResultRectRel).Max.y = fVar5 - fVar2;
    if (pIVar7->NavMoveRequest == false) {
      pIVar7->NavAnyRequest = false;
    }
    else {
      pIVar7->NavAnyRequest = true;
      if (pIVar7->NavWindow == (ImGuiWindow *)0x0) {
        __assert_fail("g.NavWindow != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x2439,"void ImGui::NavUpdateAnyRequestFlag()");
      }
    }
    bVar8 = IsItemVisible();
    if (!bVar8) {
      SetScrollHereY(0.5);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}